

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::Lookup::ensureAccessible
               (Symbol *symbol,ASTContext *context,optional<slang::SourceRange> sourceRange)

{
  Scope *pSVar1;
  bool bVar2;
  ClassType *sourceScope;
  Diagnostic *pDVar3;
  pair<const_slang::ast::ClassType_*,_bool> pVar4;
  
  if (((context->randomizeDetails != (RandomizeDetails *)0x0) &&
      (pSVar1 = context->randomizeDetails->classType, pSVar1 != (Scope *)0x0)) &&
     (bVar2 = isAccessibleFrom(symbol,pSVar1->thisSym), bVar2)) {
    return true;
  }
  pVar4 = getContainingClass((context->scope).ptr);
  sourceScope = pVar4.first;
  if (((sourceScope == (ClassType *)0x0) ||
      (bVar2 = isAccessibleFrom(symbol,(Symbol *)sourceScope), bVar2)) ||
     (bVar2 = anon_unknown_39::withinCovergroup(symbol,(context->scope).ptr), bVar2)) {
    if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (((context->flags).m_bits & 0x40) == 0)) {
      if (sourceScope != (ClassType *)0x0) {
        return true;
      }
      bVar2 = anon_unknown_39::withinCovergroup(symbol,(context->scope).ptr);
      if (bVar2) {
        return true;
      }
    }
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
      return false;
    }
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x1d000a,
                                 sourceRange.super__Optional_base<slang::SourceRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                 _M_payload._M_value);
    sourceScope = (ClassType *)symbol;
  }
  else {
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged != true) {
      return false;
    }
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x1a000a,
                                 sourceRange.super__Optional_base<slang::SourceRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::SourceRange>.
                                 _M_payload._M_value);
    pDVar3 = Diagnostic::operator<<(pDVar3,symbol->name);
  }
  Diagnostic::operator<<(pDVar3,(sourceScope->super_Type).super_Symbol.name);
  return false;
}

Assistant:

bool Lookup::ensureAccessible(const Symbol& symbol, const ASTContext& context,
                              std::optional<SourceRange> sourceRange) {
    if (context.randomizeDetails && context.randomizeDetails->classType &&
        Lookup::isAccessibleFrom(symbol, context.randomizeDetails->classType->asSymbol())) {
        return true;
    }

    auto [parent, inStatic] = getContainingClass(*context.scope);
    if (parent && !isAccessibleFrom(symbol, *parent) && !withinCovergroup(symbol, *context.scope)) {
        if (sourceRange) {
            auto& diag = context.addDiag(diag::NestedNonStaticClassProperty, *sourceRange);
            diag << symbol.name << parent->name;
        }
        return false;
    }
    else if (inStatic || context.flags.has(ASTFlags::StaticInitializer) ||
             (!parent && !withinCovergroup(symbol, *context.scope))) {
        if (sourceRange)
            context.addDiag(diag::NonStaticClassProperty, *sourceRange) << symbol.name;
        return false;
    }
    return true;
}